

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int cli_get_option_predicate(void *data)

{
  char *__s1;
  int iVar1;
  cli_option option;
  void *data_local;
  
  __s1 = *data;
  if ((__s1 == (char *)0x0) || (g_cli_get_option_name == (char *)0x0)) {
    if ((__s1 == (char *)0x0) && (g_cli_get_option_name == (char *)0x0)) {
      data_local._4_4_ = 1;
    }
    else {
      data_local._4_4_ = 0;
    }
  }
  else {
    iVar1 = strcmp(__s1,g_cli_get_option_name);
    data_local._4_4_ = (uint)(iVar1 == 0);
  }
  return data_local._4_4_;
}

Assistant:

static int cli_get_option_predicate(void *data)
{
	struct cli_option option = *(struct cli_option *)data;
	if (option.name != NULL && g_cli_get_option_name != NULL) {
		return strcmp(option.name, g_cli_get_option_name) == 0;
	}
	if (option.name != NULL || g_cli_get_option_name != NULL) {
		return 0;
	}
	return 1;
}